

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 *local_a8;
  string mode;
  string outFile;
  string inFile;
  string modelFile;
  
  if (argc < 2) {
    PrintUsage(argv);
    return 0x2a;
  }
  std::__cxx11::string::string
            ((string *)&local_a8,argv[1],(allocator *)(inFile.field_2._M_local_buf + 8));
  iVar1 = std::__cxx11::string::compare((char *)&local_a8);
  if (iVar1 == 0) {
    if (4 < argc) {
      std::__cxx11::string::string
                ((string *)(inFile.field_2._M_local_buf + 8),argv[2],
                 (allocator *)(outFile.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)(outFile.field_2._M_local_buf + 8),argv[3],
                 (allocator *)(mode.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)(mode.field_2._M_local_buf + 8),argv[4],
                 (allocator *)(modelFile.field_2._M_local_buf + 0xf));
      Train((string *)((long)&inFile.field_2 + 8),(string *)((long)&outFile.field_2 + 8),
            (string *)((long)&mode.field_2 + 8));
      if ((size_type *)mode.field_2._8_8_ != &outFile._M_string_length) {
        operator_delete((void *)mode.field_2._8_8_);
      }
      if ((size_type *)outFile.field_2._8_8_ != &inFile._M_string_length) {
        operator_delete((void *)outFile.field_2._8_8_);
      }
      if ((size_type *)inFile.field_2._8_8_ != &modelFile._M_string_length) {
        operator_delete((void *)inFile.field_2._8_8_);
      }
      iVar1 = 0;
      goto LAB_00106b0f;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar1 == 0) {
      if (argc != 2) {
        std::__cxx11::string::string
                  ((string *)(inFile.field_2._M_local_buf + 8),argv[2],
                   (allocator *)(outFile.field_2._M_local_buf + 8));
        iVar1 = Score((string *)((long)&inFile.field_2 + 8));
        goto LAB_00106afd;
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar1 == 0) {
        if (argc != 2) {
          std::__cxx11::string::string
                    ((string *)(inFile.field_2._M_local_buf + 8),argv[2],
                     (allocator *)(outFile.field_2._M_local_buf + 8));
          iVar1 = Correct((string *)((long)&inFile.field_2 + 8));
          goto LAB_00106afd;
        }
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_a8);
        if (4 < argc && iVar1 == 0) {
          std::__cxx11::string::string
                    ((string *)(inFile.field_2._M_local_buf + 8),argv[2],
                     (allocator *)(outFile.field_2._M_local_buf + 8));
          std::__cxx11::string::string
                    ((string *)(outFile.field_2._M_local_buf + 8),argv[3],
                     (allocator *)(mode.field_2._M_local_buf + 8));
          std::__cxx11::string::string
                    ((string *)(mode.field_2._M_local_buf + 8),argv[4],
                     (allocator *)(modelFile.field_2._M_local_buf + 0xf));
          iVar1 = Fix((string *)((long)&inFile.field_2 + 8),(string *)((long)&outFile.field_2 + 8),
                      (string *)((long)&mode.field_2 + 8));
          if ((size_type *)mode.field_2._8_8_ != &outFile._M_string_length) {
            operator_delete((void *)mode.field_2._8_8_);
          }
          if ((size_type *)outFile.field_2._8_8_ != &inFile._M_string_length) {
            operator_delete((void *)outFile.field_2._8_8_);
          }
LAB_00106afd:
          if ((size_type *)inFile.field_2._8_8_ != &modelFile._M_string_length) {
            operator_delete((void *)inFile.field_2._8_8_);
          }
          goto LAB_00106b0f;
        }
      }
    }
  }
  iVar1 = 0x2a;
  PrintUsage(argv);
LAB_00106b0f:
  if ((size_type *)local_a8 != &mode._M_string_length) {
    operator_delete(local_a8);
  }
  return iVar1;
}

Assistant:

int main(int argc, const char** argv) {
    if (argc < 2) {
        PrintUsage(argv);
        return 42;
    }
    std::string mode = argv[1];
    if (mode == "train") {
        if (argc < 5) {
            PrintUsage(argv);
            return 42;
        }
        std::string alphabetFile = argv[2];
        std::string datasetFile = argv[3];
        std::string resultModelFile = argv[4];
        return Train(alphabetFile, datasetFile, resultModelFile);
    } else if (mode == "score") {
        if (argc < 3) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        return Score(modelFile);
    } else if (mode == "correct") {
        if (argc < 3) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        return Correct(modelFile);
    } else if (mode == "fix") {
        if (argc < 5) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        std::string inFile = argv[3];
        std::string outFile = argv[4];
        return Fix(modelFile, inFile, outFile);
    }

    PrintUsage(argv);
    return 42;
}